

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O1

void api_suite::api_lower_bound(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  constant_map<int,_int,_4UL,_std::less<int>_> *pcVar4;
  constant_map<int,_int,_4UL,_std::less<int>_> *pcVar5;
  long lVar6;
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  constant_map<int,_int,_4UL,_std::less<int>_> local_48;
  value_type local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  pcVar4 = &local_48;
  pcVar5 = &local_48;
  local_18 = 0x300000021;
  uStack_10 = 0x10000000b;
  local_28.first = 0x16;
  local_28.second = 2;
  uStack_20 = 0x40000002c;
  vista::constant_map<int,_int,_4UL,_std::less<int>_>::constant_map
            (&local_48,(value_type (*) [4])&local_28);
  lVar1 = 4;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (9 < *(int *)((long)pcVar4 + lVar2 * 2 * 4)) {
      lVar3 = 0;
    }
    pcVar4 = (constant_map<int,_int,_4UL,_std::less<int>_> *)((long)pcVar4 + lVar3 * 2 * 4);
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  boost::detail::test_impl
            ("map.lower_bound(10) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x78,"void api_suite::api_lower_bound()",
             (constant_map<int,_int,_4UL,_std::less<int>_> *)
             ((long)pcVar4 + (ulong)(*(int *)pcVar4 < 10) * 2 * 4) == &local_48);
  lVar1 = 4;
  do {
    lVar2 = lVar1 >> 1;
    lVar3 = lVar2;
    if (10 < *(int *)((long)pcVar5 + lVar2 * 2 * 4)) {
      lVar3 = 0;
    }
    pcVar5 = (constant_map<int,_int,_4UL,_std::less<int>_> *)((long)pcVar5 + lVar3 * 2 * 4);
    lVar1 = lVar1 - lVar2;
  } while (1 < lVar1);
  boost::detail::test_impl
            ("map.lower_bound(11) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x79,"void api_suite::api_lower_bound()",
             (constant_map<int,_int,_4UL,_std::less<int>_> *)
             ((long)pcVar5 + (ulong)(*(int *)pcVar5 < 0xb) * 2 * 4) == &local_48);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0xc) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(12) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7a,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0xc) * 8 == 8);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x16) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(22) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7b,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x16) * 8 == 8);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x17) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(23) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7c,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x17) * 8 == 0x10);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x21) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(33) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7d,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x21) * 8 == 0x10);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x22) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(34) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7e,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x22) * 8 == 0x18);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x2c) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(44) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7f,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x2c) * 8 == 0x18);
  lVar3 = 4;
  lVar1 = 0;
  do {
    lVar2 = lVar3 >> 1;
    if (*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>._M_elems[lVar2].first +
                lVar1) < 0x2d) {
      lVar6 = lVar2 * 8;
    }
    else {
      lVar6 = 0;
    }
    lVar1 = lVar1 + lVar6;
    lVar3 = lVar3 - lVar2;
  } while (1 < lVar3);
  boost::detail::test_impl
            ("map.lower_bound(45) == map.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x80,"void api_suite::api_lower_bound()",
             lVar1 + (ulong)(*(int *)((long)&local_48.super_array<vista::pair<int,_int>,_4UL>.
                                             _M_elems[0].first + lVar1) < 0x2d) * 8 == 0x20);
  return;
}

Assistant:

void api_lower_bound()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST(map.lower_bound(10) == map.begin());
    BOOST_TEST(map.lower_bound(11) == map.begin());
    BOOST_TEST(map.lower_bound(12) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(22) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(23) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(33) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(34) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(44) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(45) == map.end());
}